

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

ArrayPtr<const_char> kj::_::splitNext(ArrayPtr<const_char> *cursor,char delimiter)

{
  size_t __n;
  void *pvVar1;
  ulong uVar2;
  char *__s;
  undefined7 in_register_00000031;
  ArrayPtr<const_char> AVar3;
  
  __s = cursor->ptr;
  __n = cursor->size_;
  pvVar1 = memchr(__s,(int)CONCAT71(in_register_00000031,delimiter),__n);
  if (pvVar1 == (void *)0x0) {
    __s = cursor->ptr;
    uVar2 = cursor->size_;
    cursor->ptr = (char *)0x0;
    cursor->size_ = 0;
  }
  else {
    uVar2 = (long)pvVar1 - (long)__s;
    cursor->ptr = (char *)((long)pvVar1 + 1);
    cursor->size_ = ~uVar2 + __n;
  }
  AVar3.size_ = uVar2;
  AVar3.ptr = __s;
  return AVar3;
}

Assistant:

kj::ArrayPtr<const char> splitNext(kj::ArrayPtr<const char>& cursor, char delimiter) {
  // Consumes and returns the next item in a delimited list.
  //
  // If a delimiter is found:
  //  - `cursor` is updated to point to the rest of the string after the delimiter.
  //  - The text before the delimiter is returned.
  // If no delimiter is found:
  //  - `cursor` is updated to an empty string.
  //  - The text that had been in `cursor` is returned.
  //
  // (It's up to the caller to stop the loop once `cursor` is empty.)
  KJ_IF_SOME(index, cursor.findFirst(delimiter)) {
    auto part = cursor.first(index);
    cursor = cursor.slice(index + 1, cursor.size());
    return part;
  }
  kj::ArrayPtr<const char> result(kj::mv(cursor));
  cursor = nullptr;

  return result;
}